

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsemulatorintegration.cpp
# Opt level: O1

void __thiscall QEglFSEmulatorIntegration::screenInit(QEglFSEmulatorIntegration *this)

{
  qsizetype *pqVar1;
  int *piVar2;
  QTextStream *pQVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  QEglFSEmulatorScreen *this_00;
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  long in_FS_OFFSET;
  QJsonValueConstRef QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QJsonDocument displaysDocument;
  QJsonParseError error;
  QJsonArray screenArray;
  QArrayData *local_c0;
  undefined8 *local_b8;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 local_94;
  char *local_90;
  QTextStream *local_80;
  QByteArray local_78;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->getDisplays == (PFNQGSGETDISPLAYSPROC)0x0) {
    screenInit((QEglFSEmulatorIntegration *)&local_a8);
  }
  else {
    pqVar1 = &local_78.d.size;
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_78.d.size._0_4_ = 0xaaaaaaaa;
    local_78.d.size._4_4_ = 0xaaaaaaaa;
    uStack_60 = 0xaaaaaaaa;
    uStack_5c = 0xaaaaaaaa;
    (*this->getDisplays)((QByteArray *)pqVar1);
    local_78.d.ptr = (char *)0xffffffff;
    local_78.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    QJsonDocument::fromJson(&local_78,(QJsonParseError *)pqVar1);
    if (local_78.d.ptr._4_4_ == 0) {
      cVar4 = QJsonDocument::isArray();
      if (cVar4 != '\0') {
        local_50.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        QJsonDocument::array();
        QJsonArray::detach((longlong)&local_50);
        QJsonArray::detach((longlong)&local_50);
        lVar6 = QJsonArray::size();
        if (lVar6 * 2 != 0) {
          lVar9 = 0;
          do {
            uStack_a0 = (undefined4)lVar9;
            uStack_9c = (undefined4)((ulong)lVar9 >> 0x20);
            QVar10._8_8_ = lVar9;
            QVar10.field_0.a = (QJsonArray *)&local_50;
            local_a8.a = (QJsonArray *)&local_50;
            iVar5 = QJsonValueConstRef::concreteType(QVar10);
            if (iVar5 == 5) {
              this_00 = (QEglFSEmulatorScreen *)operator_new(0x78);
              QJsonValueRef::toObject();
              QEglFSEmulatorScreen::QEglFSEmulatorScreen(this_00,(QJsonObject *)&local_c0);
              QWindowSystemInterface::handleScreenAdded((QPlatformScreen *)this_00,false);
              QJsonObject::~QJsonObject((QJsonObject *)&local_c0);
            }
            lVar7 = lVar9 + 2;
            lVar9 = lVar9 + 2;
          } while (lVar7 != lVar6 * 2);
        }
        QJsonArray::~QJsonArray((QJsonArray *)&local_50);
      }
    }
    else {
      local_a8._0_4_ = 2;
      local_a8._4_4_ = 0;
      uStack_a0 = 0;
      uStack_9c = 0;
      uStack_98 = 0;
      local_94 = 0;
      local_90 = "default";
      QMessageLogger::warning();
      pQVar3 = local_80;
      QVar11.m_data = (storage_type *)0x39;
      QVar11.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<(pQVar3,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_80[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(local_80,' ');
      }
      QJsonParseError::errorString();
      if (local_b8 == (undefined8 *)0x0) {
        local_b8 = &QString::_empty;
      }
      QDebug::putString((QChar *)&local_80,(ulong)local_b8);
      if (local_80[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(local_80,' ');
      }
      pQVar3 = local_80;
      QVar12.m_data = (storage_type *)0xb;
      QVar12.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar12);
      QTextStream::operator<<(pQVar3,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_80[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(local_80,' ');
      }
      QTextStream::operator<<(local_80,(int)local_78.d.ptr);
      if (local_80[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(local_80,' ');
      }
      pQVar3 = local_80;
      QVar13.m_data = (storage_type *)0x3;
      QVar13.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar13);
      QTextStream::operator<<(pQVar3,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_80[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(local_80,' ');
      }
      puVar8 = (undefined8 *)CONCAT44(uStack_5c,uStack_60);
      if (puVar8 == (undefined8 *)0x0) {
        puVar8 = &QByteArray::_empty;
      }
      QDebug::putByteArray((char *)&local_80,(ulong)puVar8,(Latin1Content)local_58);
      if (local_80[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(local_80,' ');
      }
      if (local_c0 != (QArrayData *)0x0) {
        LOCK();
        (local_c0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c0,2,0x10);
        }
      }
      QDebug::~QDebug((QDebug *)&local_80);
    }
    QJsonDocument::~QJsonDocument((QJsonDocument *)&local_78);
    piVar2 = (int *)CONCAT44(local_78.d.size._4_4_,(undefined4)local_78.d.size);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_78.d.size._4_4_,(undefined4)local_78.d.size),1,0x10)
        ;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSEmulatorIntegration::screenInit()
{
    // Use qgsGetDisplays() call to retrieve the available screens from the Emulator
    if (getDisplays) {
        QByteArray displaysInfo = getDisplays();
        QJsonParseError error;
        QJsonDocument displaysDocument = QJsonDocument::fromJson(displaysInfo, &error);
        if (error.error == QJsonParseError::NoError) {
            // Document should be an array of screen objects
            if (displaysDocument.isArray()){
                QJsonArray screenArray = displaysDocument.array();
                for (auto screenValue : screenArray) {
                    if (screenValue.isObject())
                        QWindowSystemInterface::handleScreenAdded(new QEglFSEmulatorScreen(screenValue.toObject()));
                }
            }
        } else {
            qWarning() << "eglfs_emu: Failed to parse display info JSON with error: " << error.errorString()
                       << " at offset " << error.offset << " : " << displaysInfo;

        }
    } else {
        qFatal("EGL library doesn't support Emulator extensions");
    }
}